

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxDomain.cpp
# Opt level: O2

BoxDomain * __thiscall amrex::BoxDomain::rmBox(BoxDomain *this,Box *b)

{
  pointer pBVar1;
  bool bVar2;
  Box *this_00;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> tmp;
  _Vector_base<amrex::Box,_std::allocator<amrex::Box>_> local_68;
  BoxList local_50;
  
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (Box *)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar1 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_BoxList).m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pBVar1; this_00 = this_00 + 1) {
    bVar2 = Box::intersects(this_00,b);
    if (bVar2) {
      boxDiff(&local_50,this_00,b);
      std::vector<amrex::Box,std::allocator<amrex::Box>>::
      insert<__gnu_cxx::__normal_iterator<amrex::Box_const*,std::vector<amrex::Box,std::allocator<amrex::Box>>>,void>
                ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_68,
                 (const_iterator)local_68._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                  )local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<const_amrex::Box_*,_std::vector<amrex::Box,_std::allocator<amrex::Box>_>_>
                  )local_50.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      (this_00->smallend).vect[0] = 1;
      (this_00->smallend).vect[1] = 1;
      (this_00->smallend).vect[2] = 1;
      (this_00->bigend).vect[0] = 0;
      (this_00->bigend).vect[1] = 0;
      *(undefined8 *)((this_00->bigend).vect + 2) = 0;
      std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base
                ((_Vector_base<amrex::Box,_std::allocator<amrex::Box>_> *)&local_50);
    }
  }
  BoxList::removeEmpty(&this->super_BoxList);
  BoxList::join(&this->super_BoxList,(Vector<amrex::Box,_std::allocator<amrex::Box>_> *)&local_68);
  std::_Vector_base<amrex::Box,_std::allocator<amrex::Box>_>::~_Vector_base(&local_68);
  return this;
}

Assistant:

BoxDomain&
BoxDomain::rmBox (const Box& b)
{
    BL_ASSERT(b.ixType() == ixType());

    Vector<Box> tmp;

    for (auto& bx : *this)
    {
        if (bx.intersects(b))
        {
            const BoxList& tmpbl = amrex::boxDiff(bx,b);
            tmp.insert(std::end(tmp), std::begin(tmpbl), std::end(tmpbl));
            bx = Box();
        }
    }
    removeEmpty();
    join(tmp);
    return *this;
}